

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mo_lambda.cpp
# Opt level: O1

plural_ptr __thiscall
booster::locale::gnu_gettext::lambda::anon_unknown_0::parser::cond_expr(parser *this)

{
  int iVar1;
  undefined8 *puVar2;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> _Var3;
  plural *ppVar4;
  undefined8 *in_RSI;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> _Var5;
  int res;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_50;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_48;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_40;
  _Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false> local_38;
  
  l2((parser *)&local_50);
  if (local_50._M_head_impl == (plural *)0x0) {
    ppVar4 = (plural *)0x0;
    _Var5._M_head_impl = local_50._M_head_impl;
  }
  else {
    _Var3._M_head_impl = local_50._M_head_impl;
    local_38._M_head_impl = (plural *)this;
    do {
      if (((tokenizer *)*in_RSI)->next_tocken != 0x107) {
        _Var5._M_head_impl = (plural *)0x0;
        ppVar4 = _Var3._M_head_impl;
        this = (parser *)local_38._M_head_impl;
        goto LAB_00179ad8;
      }
      tokenizer::step((tokenizer *)*in_RSI);
      l2((parser *)&local_50);
      _Var5._M_head_impl = local_50._M_head_impl;
      if (local_50._M_head_impl != (plural *)0x0) {
        local_48._M_head_impl = local_50._M_head_impl;
        local_40._M_head_impl = _Var3._M_head_impl;
        bin_factory((anon_unknown_0 *)&local_50,0x107,(plural_ptr *)&local_40,
                    (plural_ptr *)&local_48);
        _Var3._M_head_impl = local_50._M_head_impl;
        local_50._M_head_impl = (plural *)0x0;
        if (local_48._M_head_impl != (plural *)0x0) {
          (*(local_48._M_head_impl)->_vptr_plural[3])();
        }
        local_48._M_head_impl = (plural *)0x0;
        if (local_40._M_head_impl != (plural *)0x0) {
          (*(local_40._M_head_impl)->_vptr_plural[3])();
        }
        local_40._M_head_impl = (plural *)0x0;
      }
    } while (_Var5._M_head_impl != (plural *)0x0);
    ppVar4 = (plural *)0x0;
    _Var5._M_head_impl = _Var3._M_head_impl;
    this = (parser *)local_38;
  }
LAB_00179ad8:
  if (_Var5._M_head_impl != (plural *)0x0) {
    (*(_Var5._M_head_impl)->_vptr_plural[3])();
  }
  if (ppVar4 == (plural *)0x0) {
    *this = (tokenizer *)0x0;
  }
  else {
    if (((tokenizer *)*in_RSI)->next_tocken == 0x3f) {
      tokenizer::step((tokenizer *)*in_RSI);
      cond_expr((parser *)&local_50);
      _Var5._M_head_impl = local_50._M_head_impl;
      if (((local_50._M_head_impl == (plural *)0x0) ||
          (iVar1 = ((tokenizer *)*in_RSI)->next_tocken, tokenizer::step((tokenizer *)*in_RSI),
          iVar1 != 0x3a)) ||
         (cond_expr((parser *)&local_50), _Var3._M_head_impl = local_50._M_head_impl,
         local_50._M_head_impl == (plural *)0x0)) {
        *this = (tokenizer *)0x0;
        goto LAB_00179b73;
      }
      puVar2 = (undefined8 *)operator_new(0x20);
      *puVar2 = &PTR_operator___001d1558;
      puVar2[1] = ppVar4;
      puVar2[2] = _Var5._M_head_impl;
      puVar2[3] = _Var3._M_head_impl;
      *this = (parser)puVar2;
    }
    else {
      *this = (parser)ppVar4;
    }
    ppVar4 = (plural *)0x0;
  }
  _Var5._M_head_impl = (plural *)0x0;
LAB_00179b73:
  if (_Var5._M_head_impl != (plural *)0x0) {
    (*(_Var5._M_head_impl)->_vptr_plural[3])(_Var5._M_head_impl);
  }
  if (ppVar4 != (plural *)0x0) {
    (*ppVar4->_vptr_plural[3])(ppVar4);
  }
  return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
          )(tuple<booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            )this;
}

Assistant:

plural_ptr cond_expr()
        {
            plural_ptr cond,case1,case2;
            if((cond=l1()).get()==0)
                return plural_ptr();
            if(t.next()=='?') {
                t.get();
                if((case1=cond_expr()).get()==0)
                    return plural_ptr();
                if(t.get()!=':')
                    return plural_ptr();
                if((case2=cond_expr()).get()==0)
                    return plural_ptr();
            }
            else {
                return cond;
            }
            return plural_ptr(new conditional(std::move(cond),std::move(case1),std::move(case2)));
        }